

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cpp
# Opt level: O2

string * __thiscall
duckdb::ParsedExtensionMetaData::GetInvalidMetadataError_abi_cxx11_
          (string *__return_storage_ptr__,ParsedExtensionMetaData *this)

{
  ExtensionABIType EVar1;
  bool bVar2;
  InternalException *this_00;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  int in_stack_fffffffffffffde8;
  allocator local_211;
  string engine_version;
  idx_t minor;
  idx_t patch;
  idx_t major;
  string engine_platform;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  string local_160 [32];
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40 [32];
  
  DuckDB::Platform_abi_cxx11_();
  bVar2 = AppearsValid(this);
  if (!bVar2) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               "The file is not a DuckDB extension. The metadata at the end of the file is invalid",
               (allocator *)&engine_version);
    goto LAB_0044ab65;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  EVar1 = this->abi_type;
  if (EVar1 == C_STRUCT_UNSTABLE) {
LAB_0044a9bd:
    ExtensionHelper::GetVersionDirectoryName_abi_cxx11_();
    bVar2 = ::std::operator!=(&engine_version,&this->duckdb_version);
    if (bVar2) {
      ::std::__cxx11::string::string
                (local_40,
                 "The file was built specifically for DuckDB version \'%s\' and can only be loaded with that version of DuckDB. (this version of DuckDB is \'%s\')"
                 ,(allocator *)&minor);
      PrettyPrintString(&local_60,&this->duckdb_version);
      ::std::__cxx11::string::string((string *)&local_80,(string *)&engine_version);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&major,(StringUtil *)local_40,&local_60,&local_80,in_R8);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&major);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::__cxx11::string::~string(local_40);
    }
    psVar3 = &engine_version;
LAB_0044aa80:
    ::std::__cxx11::string::~string((string *)psVar3);
  }
  else {
    if (EVar1 != C_STRUCT) {
      if (EVar1 != CPP) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::operator+(&engine_version,"Unknown ABI type for extension: ",
                         &this->extension_abi_metadata);
        InternalException::InternalException(this_00,&engine_version);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_0044a9bd;
    }
    psVar3 = &this->duckdb_capi_version;
    bVar2 = VersioningUtils::ParseSemver
                      ((VersioningUtils *)psVar3,(string *)&major,&minor,&patch,(idx_t *)in_R8);
    if (!bVar2) {
      ::std::__cxx11::string::string
                ((string *)&local_a0,
                 "The file was built for DuckDB C API version \'%s\', which failed to parse as a recognized version string"
                 ,&local_211);
      ::std::__cxx11::string::string((string *)&local_c0,(string *)psVar3);
      StringUtil::Format<std::__cxx11::string,int>
                (&engine_version,(StringUtil *)&local_a0,&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,(int)in_R8
                );
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&engine_version);
      ::std::__cxx11::string::~string((string *)&local_c0);
      psVar3 = &local_a0;
      goto LAB_0044aa80;
    }
    if (major != 1) {
      ::std::__cxx11::string::string
                ((string *)&local_e0,
                 "The file was built for DuckDB C API version \'%s\', but we can only load extensions built for DuckDB C API \'v%lld.x.y\'."
                 ,&local_211);
      ::std::__cxx11::string::string((string *)&local_100,(string *)psVar3);
      StringUtil::Format<std::__cxx11::string,int>
                (&engine_version,(StringUtil *)&local_e0,&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,(int)in_R8
                );
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&engine_version);
      ::std::__cxx11::string::~string((string *)&local_100);
      psVar3 = &local_e0;
      goto LAB_0044aa80;
    }
    if ((2 < minor) || ((minor == 2 && (patch != 0)))) {
      ::std::__cxx11::string::string
                ((string *)&local_120,
                 "The file was built for DuckDB C API version \'%s\', but we can only load extensions built for DuckDB C API \'v%lld.%lld.%lld\' and lower."
                 ,&local_211);
      ::std::__cxx11::string::string((string *)&local_140,(string *)psVar3);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      StringUtil::Format<std::__cxx11::string,int,int,int>
                (&engine_version,(StringUtil *)&local_120,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,2,0,
                 in_stack_fffffffffffffde8);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&engine_version);
      ::std::__cxx11::string::~string((string *)&local_140);
      psVar3 = &local_120;
      goto LAB_0044aa80;
    }
  }
  bVar2 = ::std::operator!=(&engine_platform,&this->platform);
  if (bVar2) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::string
              (local_160,
               "he file was built for the platform \'%s\', but we can only load extensions built for platform \'%s\'."
               ,(allocator *)&major);
    PrettyPrintString(&local_180,&this->platform);
    ::std::__cxx11::string::string((string *)&local_1a0,(string *)&engine_platform);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&engine_version,(StringUtil *)local_160,&local_180,&local_1a0,in_R8);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&engine_version);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_180);
    ::std::__cxx11::string::~string(local_160);
  }
LAB_0044ab65:
  ::std::__cxx11::string::~string((string *)&engine_platform);
  return __return_storage_ptr__;
}

Assistant:

string ParsedExtensionMetaData::GetInvalidMetadataError() {
	const string engine_platform = string(DuckDB::Platform());

	if (!AppearsValid()) {
		return "The file is not a DuckDB extension. The metadata at the end of the file is invalid";
	}

	string result;

	// CPP or C_STRUCT_UNSTABLE ABI versioning needs to match the DuckDB version exactly
	if (abi_type == ExtensionABIType::CPP || abi_type == ExtensionABIType::C_STRUCT_UNSTABLE) {
		const string engine_version = string(ExtensionHelper::GetVersionDirectoryName());

		if (engine_version != duckdb_version) {
			result += StringUtil::Format("The file was built specifically for DuckDB version '%s' and can only be "
			                             "loaded with that version of DuckDB. (this version of DuckDB is '%s')",
			                             PrettyPrintString(duckdb_version), engine_version);
		}
		// C_STRUCT ABI versioning
	} else if (abi_type == ExtensionABIType::C_STRUCT) {
		idx_t major, minor, patch;
		if (!VersioningUtils::ParseSemver(duckdb_capi_version, major, minor, patch)) {
			result += StringUtil::Format("The file was built for DuckDB C API version '%s', which failed to parse as a "
			                             "recognized version string",
			                             duckdb_capi_version, DUCKDB_EXTENSION_API_VERSION_MAJOR);
		} else if (major != DUCKDB_EXTENSION_API_VERSION_MAJOR) {
			// Special case where the extension is built for a completely unsupported API
			result +=
			    StringUtil::Format("The file was built for DuckDB C API version '%s', but we can only load extensions "
			                       "built for DuckDB C API 'v%lld.x.y'.",
			                       duckdb_capi_version, DUCKDB_EXTENSION_API_VERSION_MAJOR);
		} else if (!VersioningUtils::IsSupportedCAPIVersion(major, minor, patch)) {
			result +=
			    StringUtil::Format("The file was built for DuckDB C API version '%s', but we can only load extensions "
			                       "built for DuckDB C API 'v%lld.%lld.%lld' and lower.",
			                       duckdb_capi_version, DUCKDB_EXTENSION_API_VERSION_MAJOR,
			                       DUCKDB_EXTENSION_API_VERSION_MINOR, DUCKDB_EXTENSION_API_VERSION_PATCH);
		}
	} else {
		throw InternalException("Unknown ABI type for extension: " + extension_abi_metadata);
	}

	if (engine_platform != platform) {
		if (!result.empty()) {
			result += " Also, t";
		} else {
			result += "T";
		}
		result += StringUtil::Format(
		    "he file was built for the platform '%s', but we can only load extensions built for platform '%s'.",
		    PrettyPrintString(platform), engine_platform);
	}

	return result;
}